

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::cftx020(double *a)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *a;
  dVar2 = a[1];
  *a = dVar1 + a[2];
  a[1] = dVar2 + a[3];
  a[2] = dVar1 - a[2];
  a[3] = dVar2 - a[3];
  return;
}

Assistant:

void cftx020(double *a) {
  double x0r, x0i;

  x0r = a[0] - a[2];
  x0i = a[1] - a[3];
  a[0] += a[2];
  a[1] += a[3];
  a[2] = x0r;
  a[3] = x0i;
}